

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O3

void __thiscall
Js::TypedArrayBase::SetObject
          (TypedArrayBase *this,RecyclableObject *source,uint32 targetLength,uint32 offset)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint32 uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  undefined8 local_40;
  Var itemValue;
  
  itemValue = (((((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
              super_JavascriptLibraryBase).scriptContext.ptr;
  uVar3 = GetSourceLength(this,source,targetLength,offset);
  if (uVar3 != 0) {
    uVar1 = *(undefined8 *)(*(long *)((long)itemValue + 8) + 0x430);
    uVar6 = 0;
    do {
      iVar4 = (*(source->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x26])(source,source,uVar6,&local_40,itemValue);
      uVar2 = uVar1;
      if (iVar4 == 1) {
        uVar2 = local_40;
      }
      local_40 = uVar2;
      (*(this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.super_RecyclableObject
        .super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x70])
                (this,(ulong)(offset + (int)uVar6),local_40);
      uVar5 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar5;
    } while (uVar3 != uVar5);
  }
  return;
}

Assistant:

void TypedArrayBase::SetObject(RecyclableObject* source, uint32 targetLength, uint32 offset)
    {
        ScriptContext* scriptContext = GetScriptContext();
        uint32 sourceLength = GetSourceLength(source, targetLength, offset);

        Var itemValue;
        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();
        for (uint32 i = 0; i < sourceLength; i ++)
        {
            if (!source->GetItem(source, i, &itemValue, scriptContext))
            {
                itemValue = undefinedValue;
            }
            DirectSetItem(offset + i, itemValue);
        }
    }